

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readValue(Reader *this)

{
  bool bVar1;
  Value *pVVar2;
  allocator local_99;
  string local_98;
  Value local_78;
  Value local_68 [2];
  Value local_48;
  byte local_31;
  undefined1 local_30 [7];
  bool successful;
  Token token;
  Reader *this_local;
  
  token.end_ = (Location)this;
  skipCommentTokens(this,(Token *)local_30);
  local_31 = 1;
  switch(local_30._0_4_) {
  case 1:
    local_31 = readObject(this,(Token *)local_30);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"Syntax error: value, object or array expected.",&local_99);
    bVar1 = addError(this,&local_98,(Token *)local_30,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    return bVar1;
  case 3:
    local_31 = readArray(this,(Token *)local_30);
    break;
  case 5:
    local_31 = decodeString(this,(Token *)local_30);
    break;
  case 6:
    local_31 = decodeNumber(this,(Token *)local_30);
    break;
  case 7:
    local_31 = decodeDouble(this,(Token *)local_30);
    break;
  case 8:
    Value::Value(&local_48,true);
    pVVar2 = currentValue(this);
    Value::operator=(pVVar2,&local_48);
    Value::~Value(&local_48);
    break;
  case 9:
    Value::Value(local_68,false);
    pVVar2 = currentValue(this);
    Value::operator=(pVVar2,local_68);
    Value::~Value(local_68);
    break;
  case 10:
    Value::Value(&local_78,nullValue);
    pVVar2 = currentValue(this);
    Value::operator=(pVVar2,&local_78);
    Value::~Value(&local_78);
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool
Reader::readValue ()
{
    Token token;
    skipCommentTokens ( token );
    bool successful = true;

    switch ( token.type_ )
    {
    case tokenObjectBegin:
        successful = readObject ( token );
        break;

    case tokenArrayBegin:
        successful = readArray ( token );
        break;

    case tokenInteger:
        successful = decodeNumber ( token );
        break;

    case tokenDouble:
        successful = decodeDouble ( token );
        break;

    case tokenString:
        successful = decodeString ( token );
        break;

    case tokenTrue:
        currentValue () = true;
        break;

    case tokenFalse:
        currentValue () = false;
        break;

    case tokenNull:
        currentValue () = Value ();
        break;

    default:
        return addError ( "Syntax error: value, object or array expected.", token );
    }

    return successful;
}